

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_23::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((Descriptor *)this != lhs) {
    __n = (*(undefined8 **)(this + 8))[1];
    if (__n != lhs->all_names_->_M_string_length) {
      return false;
    }
    if (__n != 0) {
      iVar1 = bcmp((void *)**(undefined8 **)(this + 8),(lhs->all_names_->_M_dataplus)._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }